

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.c
# Opt level: O3

config_value * config_value_create_array(size_t length)

{
  config_value *__ptr;
  config_array *pcVar1;
  
  __ptr = (config_value *)malloc(0x10);
  if (__ptr != (config_value *)0x0) {
    __ptr->type = ARRAY;
    pcVar1 = config_array_create(length);
    (__ptr->data).array = pcVar1;
    if (pcVar1 != (config_array *)0x0) {
      return __ptr;
    }
    free(__ptr);
  }
  return (config_value *)0x0;
}

Assistant:

struct config_value *config_value_create_array(size_t length)
{
        struct config_value *value = malloc(sizeof(struct config_value));

        if (value == NULL) {
                return NULL;
        }

        value->type = ARRAY;

        value->data.array = config_array_create(length);

        if (value->data.array == NULL) {
                free(value);

                return NULL;
        }

        return value;
}